

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

uint64_t __thiscall rcg::Stream::getNumStarted(Stream *this)

{
  unsigned_long uVar1;
  lock_guard<std::recursive_mutex> *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  STREAM_INFO_CMD in_stack_ffffffffffffffe4;
  void *in_stack_ffffffffffffffe8;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  uVar1 = anon_unknown_6::getStreamValue<unsigned_long>
                    (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x123772);
  return uVar1;
}

Assistant:

uint64_t Stream::getNumStarted()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return getStreamValue<uint64_t>(gentl, stream, GenTL::STREAM_INFO_NUM_STARTED);
}